

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# determineIncludes.cpp
# Opt level: O1

void determineIncludes(Module *module,Program *program)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  const_iterator cVar3;
  Module *pMVar4;
  undefined1 auVar5 [16];
  string name;
  string trimmed;
  string local_70;
  string local_50;
  
  pMVar4 = *(Module **)(module + 0x20);
  if (pMVar4 != module + 0x18) {
    paVar1 = &local_70.field_2;
    do {
      auVar5 = llvm::Value::getName();
      lVar2 = auVar5._0_8_;
      local_70._M_dataplus._M_p = (pointer)paVar1;
      if (lVar2 == 0) {
        local_70._M_string_length = 0;
        local_70.field_2._M_local_buf[0] = '\0';
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,lVar2,auVar5._8_8_ + lVar2);
      }
      trimPrefix(&local_50,&local_70);
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&C_FUNCTIONS_abi_cxx11_._M_t,&local_50);
      if ((_Rb_tree_header *)cVar3._M_node !=
          &C_FUNCTIONS_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        std::__cxx11::string::_M_assign((string *)&local_70);
      }
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&STDLIB_FUNCTIONS_abi_cxx11_._M_t,&local_70);
      if ((_Rb_tree_header *)cVar3._M_node !=
          &STDLIB_FUNCTIONS_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        program->hasStdLib = true;
      }
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&STRING_FUNCTIONS_abi_cxx11_._M_t,&local_70);
      if ((_Rb_tree_header *)cVar3._M_node !=
          &STRING_FUNCTIONS_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        program->hasString = true;
      }
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&STDIO_FUNCTIONS_abi_cxx11_._M_t,&local_70);
      if ((_Rb_tree_header *)cVar3._M_node !=
          &STDIO_FUNCTIONS_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        program->hasStdio = true;
      }
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&PTHREAD_FUNCTIONS_abi_cxx11_._M_t,&local_70);
      if ((_Rb_tree_header *)cVar3._M_node !=
          &PTHREAD_FUNCTIONS_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        program->hasPthread = true;
      }
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&C_MATH_abi_cxx11_._M_t,&local_70);
      if ((_Rb_tree_header *)cVar3._M_node != &C_MATH_abi_cxx11_._M_t._M_impl.super__Rb_tree_header)
      {
        program->hasCMath = true;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
      pMVar4 = *(Module **)(pMVar4 + 8);
    } while (pMVar4 != module + 0x18);
  }
  Program::addPass(program,DetermineIncludes);
  return;
}

Assistant:

void determineIncludes(const llvm::Module* module, Program& program) {
    for (const llvm::Function& func : module->functions()) {
        std::string name = func.getName().str();
        std::string trimmed = trimPrefix(name);

        if (isCFunc(trimmed)) {
            name = trimmed;
        }

        if (isStdLibFunc(name)) {
            program.hasStdLib = true;
        }

        if (isStringFunc(name)) {
            program.hasString = true;
        }

        if (isStdioFunc(name)) {
            program.hasStdio = true;
        }

        if (isPthreadFunc(name)) {
            program.hasPthread = true;
        }

        if (isCMath(name)) {
            program.hasCMath = true;
        }

    }

    program.addPass(PassType::DetermineIncludes);
}